

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecificStrategy.h
# Opt level: O0

Stats * __thiscall SpecificStrategy::Stats::operator+=(Stats *this,Stats *stats)

{
  Stats *stats_local;
  Stats *this_local;
  
  this->instrs = stats->instrs + this->instrs;
  (this->blocks).perfect = (stats->blocks).perfect + (this->blocks).perfect;
  (this->blocks).conflict = (stats->blocks).conflict + (this->blocks).conflict;
  this->phantoms = stats->phantoms + this->phantoms;
  (this->edges).internal.perfect = (stats->edges).internal.perfect + (this->edges).internal.perfect;
  (this->edges).internal.conflict =
       (stats->edges).internal.conflict + (this->edges).internal.conflict;
  (this->edges).external.perfect = (stats->edges).external.perfect + (this->edges).external.perfect;
  (this->edges).external.conflict =
       (stats->edges).external.conflict + (this->edges).external.conflict;
  this->calls = stats->calls + this->calls;
  this->indirects = stats->indirects + this->indirects;
  return this;
}

Assistant:

Stats& operator+=(const Stats& stats) {
			instrs += stats.instrs;
			blocks.perfect += stats.blocks.perfect;
			blocks.conflict += stats.blocks.conflict;
			phantoms += stats.phantoms;
			edges.internal.perfect += stats.edges.internal.perfect;
			edges.internal.conflict += stats.edges.internal.conflict;
			edges.external.perfect += stats.edges.external.perfect;
			edges.external.conflict += stats.edges.external.conflict;
			calls += stats.calls;
			indirects += stats.indirects;

			return *this;
		}